

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

bool __thiscall ftxui::InputBase::OnEvent(InputBase *this,Event *event)

{
  bool bVar1;
  string *psVar2;
  string local_b0;
  Event local_80;
  wstring local_40;
  Event *local_20;
  Event *event_local;
  InputBase *this_local;
  
  local_20 = event;
  event_local = (Event *)this;
  psVar2 = StringRef::operator*[abi_cxx11_(&this->content_);
  to_wstring(&local_40,psVar2);
  std::__cxx11::wstring::operator=((wstring *)&this->wrapped_content_,(wstring *)&local_40);
  std::__cxx11::wstring::~wstring((wstring *)&local_40);
  Event::Event(&local_80,event);
  bVar1 = WideInputBase::OnEvent(&this->super_WideInputBase,&local_80);
  Event::~Event(&local_80);
  if (bVar1) {
    to_string(&local_b0,&this->wrapped_content_);
    psVar2 = StringRef::operator*[abi_cxx11_(&this->content_);
    std::__cxx11::string::operator=((string *)psVar2,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return bVar1;
}

Assistant:

bool OnEvent(Event event) override {
    wrapped_content_ = to_wstring(*content_);
    if (WideInputBase::OnEvent(event)) {
      *content_ = to_string(wrapped_content_);
      return true;
    }
    return false;
  }